

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O3

t_int * threshold_tilde_perform(t_int *w)

{
  float *pfVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  float fVar5;
  
  lVar2 = w[2];
  if (*(float *)(lVar2 + 0x58) <= 0.0) {
    iVar3 = (int)w[3];
    if (*(int *)(lVar2 + 0x4c) == 0) {
      if (iVar3 != 0) {
        lVar4 = 0;
        do {
          if (*(float *)(lVar2 + 0x50) <= *(float *)(w[1] + lVar4 * 4)) {
            clock_delay(*(_clock **)(lVar2 + 0x40),0.0);
            *(undefined4 *)(lVar2 + 0x4c) = 1;
            fVar5 = *(float *)(lVar2 + 0x60);
            goto LAB_0011936b;
          }
          lVar4 = lVar4 + 1;
        } while (iVar3 != (int)lVar4);
      }
    }
    else if (iVar3 != 0) {
      lVar4 = 0;
      do {
        pfVar1 = (float *)(w[1] + lVar4 * 4);
        if (*pfVar1 <= *(float *)(lVar2 + 0x54) && *(float *)(lVar2 + 0x54) != *pfVar1) {
          clock_delay(*(_clock **)(lVar2 + 0x40),0.0);
          *(undefined4 *)(lVar2 + 0x4c) = 0;
          fVar5 = *(float *)(lVar2 + 100);
          goto LAB_0011936b;
        }
        lVar4 = lVar4 + 1;
      } while (iVar3 != (int)lVar4);
    }
  }
  else {
    fVar5 = *(float *)(lVar2 + 0x58) - *(float *)(lVar2 + 0x5c);
LAB_0011936b:
    *(float *)(lVar2 + 0x58) = fVar5;
  }
  return w + 4;
}

Assistant:

static t_int *threshold_tilde_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_threshold_tilde *x = (t_threshold_tilde *)(w[2]);
    int n = (int)w[3];
    if (x->x_deadwait > 0)
        x->x_deadwait -= x->x_msecpertick;
    else if (x->x_state)
    {
            /* we're high; look for low sample */
        for (; n--; in1++)
        {
            if (*in1 < x->x_lothresh)
            {
                clock_delay(x->x_clock, 0L);
                x->x_state = 0;
                x->x_deadwait = x->x_lodeadtime;
                goto done;
            }
        }
    }
    else
    {
            /* we're low; look for high sample */
        for (; n--; in1++)
        {
            if (*in1 >= x->x_hithresh)
            {
                clock_delay(x->x_clock, 0L);
                x->x_state = 1;
                x->x_deadwait = x->x_hideadtime;
                goto done;
            }
        }
    }
done:
    return (w+4);
}